

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::SourceCodeInfo::ByteSizeLong(SourceCodeInfo *this)

{
  bool bVar1;
  int iVar2;
  reference value;
  size_t sVar3;
  SourceCodeInfo_Location *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<google::protobuf::SourceCodeInfo_Location> *__range2;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  SourceCodeInfo *this_local;
  
  iVar2 = _internal_location_size(this);
  sStack_18 = (size_t)iVar2;
  __end2 = RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::begin(&this->location_);
  msg = (SourceCodeInfo_Location *)
        RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::end(&this->location_);
  while( true ) {
    bVar1 = internal::RepeatedPtrIterator<const_google::protobuf::SourceCodeInfo_Location>::
            operator!=(&__end2,(iterator *)&msg);
    if (!bVar1) break;
    value = internal::RepeatedPtrIterator<const_google::protobuf::SourceCodeInfo_Location>::
            operator*(&__end2);
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::SourceCodeInfo_Location>(value);
    sStack_18 = sVar3 + sStack_18;
    internal::RepeatedPtrIterator<const_google::protobuf::SourceCodeInfo_Location>::operator++
              (&__end2);
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t SourceCodeInfo::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.SourceCodeInfo)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated .google.protobuf.SourceCodeInfo.Location location = 1;
  total_size += 1UL * this->_internal_location_size();
  for (const auto& msg : this->location_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}